

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value * __thiscall toml::Value::ensureValue(Value *this,string *key)

{
  bool bVar1;
  TokenType TVar2;
  string *psVar3;
  Value *pVVar4;
  string *in_RSI;
  Value *in_RDI;
  Value *v;
  Value *candidate;
  string part;
  Token t;
  Value *current;
  Lexer lexer;
  istringstream ss;
  Token *in_stack_fffffffffffffc98;
  Token *in_stack_fffffffffffffca0;
  Value *in_stack_fffffffffffffca8;
  Token *in_stack_fffffffffffffcb0;
  Value *in_stack_fffffffffffffcb8;
  Value *in_stack_fffffffffffffcc0;
  anon_union_8_8_51f126cb_for_Value_2 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  int iVar5;
  Token *in_stack_fffffffffffffd10;
  string local_260 [32];
  Token local_240;
  Value *local_200;
  Lexer local_1f8;
  istringstream local_1e8 [72];
  char (*in_stack_fffffffffffffe60) [28];
  Token *local_8;
  
  bVar1 = valid(in_RDI);
  if (!bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           *)0x2373ce);
    Value((Value *)in_stack_fffffffffffffcb0,(Table *)in_stack_fffffffffffffca8);
    operator=(in_stack_fffffffffffffca8,(Value *)in_stack_fffffffffffffca0);
    ~Value(in_stack_fffffffffffffcc0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
            *)0x23740e);
  }
  bVar1 = is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                    ((Value *)in_stack_fffffffffffffca0);
  if (bVar1) {
    std::__cxx11::istringstream::istringstream(local_1e8,in_RSI,_S_in);
    internal::Lexer::Lexer(&local_1f8,(istream *)local_1e8);
    local_200 = in_RDI;
    while( true ) {
      internal::Lexer::nextKeyToken((Lexer *)in_stack_fffffffffffffc98);
      TVar2 = internal::Token::type(&local_240);
      if ((TVar2 != IDENT) && (TVar2 = internal::Token::type(&local_240), TVar2 != STRING)) {
        failwith<char_const(&)[12]>((char (*) [12])in_stack_fffffffffffffe60);
      }
      psVar3 = internal::Token::strValue_abi_cxx11_(&local_240);
      std::__cxx11::string::string(local_260,(string *)psVar3);
      internal::Lexer::nextKeyToken((Lexer *)in_stack_fffffffffffffc98);
      internal::Token::operator=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      internal::Token::~Token((Token *)0x237565);
      TVar2 = internal::Token::type(&local_240);
      if (TVar2 == DOT) {
        pVVar4 = findChild(in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0);
        if (pVVar4 == (Value *)0x0) {
          in_stack_fffffffffffffcc0 = local_200;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                 *)0x237642);
          Value((Value *)in_stack_fffffffffffffcb0,(Table *)in_stack_fffffffffffffca8);
          in_stack_fffffffffffffcb8 =
               setChild((Value *)in_stack_fffffffffffffd10,
                        (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        (Value *)in_stack_fffffffffffffd00.string_);
          local_200 = in_stack_fffffffffffffcb8;
          ~Value(in_stack_fffffffffffffcc0);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                  *)0x23769e);
          pVVar4 = local_200;
        }
        else {
          bVar1 = is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                            ((Value *)in_stack_fffffffffffffca0);
          if (!bVar1) {
            failwith<char_const(&)[28]>(in_stack_fffffffffffffe60);
          }
        }
        local_200 = pVVar4;
        iVar5 = 0;
      }
      else {
        TVar2 = internal::Token::type(&local_240);
        if (TVar2 != END_OF_FILE) {
          failwith<char_const(&)[12]>((char (*) [12])in_stack_fffffffffffffe60);
        }
        in_stack_fffffffffffffcb0 =
             (Token *)findChild(in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0);
        in_stack_fffffffffffffd10 = in_stack_fffffffffffffcb0;
        if (in_stack_fffffffffffffcb0 == (Token *)0x0) {
          in_stack_fffffffffffffca8 = local_200;
          Value((Value *)&stack0xfffffffffffffcf8);
          local_8 = (Token *)setChild((Value *)in_stack_fffffffffffffd10,
                                      (string *)
                                      CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                      (Value *)in_stack_fffffffffffffd00.string_);
          in_stack_fffffffffffffca0 = local_8;
          ~Value(in_stack_fffffffffffffcc0);
          iVar5 = 1;
        }
        else {
          iVar5 = 1;
          local_8 = in_stack_fffffffffffffcb0;
        }
      }
      std::__cxx11::string::~string(local_260);
      internal::Token::~Token((Token *)0x2377f4);
      if (iVar5 != 0) break;
      in_stack_fffffffffffffd0c = 0;
    }
    std::__cxx11::istringstream::~istringstream(local_1e8);
    return (Value *)local_8;
  }
  failwith<char_const(&)[28]>(in_stack_fffffffffffffe60);
}

Assistant:

inline Value* Value::ensureValue(const std::string& key)
{
    if (!valid())
        *this = Value((Table()));
    if (!is<Table>()) {
        failwith("encountered non table value");
    }

    std::istringstream ss(key);
    internal::Lexer lexer(ss);

    Value* current = this;
    while (true) {
        internal::Token t = lexer.nextKeyToken();
        if (!(t.type() == internal::TokenType::IDENT || t.type() == internal::TokenType::STRING)) {
            failwith("invalid key");
        }

        std::string part = t.strValue();
        t = lexer.nextKeyToken();
        if (t.type() == internal::TokenType::DOT) {
            if (Value* candidate = current->findChild(part)) {
                if (!candidate->is<Table>())
                    failwith("encountered non table value");

                current = candidate;
            } else {
                current = current->setChild(part, Table());
            }
        } else if (t.type() == internal::TokenType::END_OF_FILE) {
            if (Value* v = current->findChild(part))
                return v;
            return current->setChild(part, Value());
        } else {
            failwith("invalid key");
        }
    }
}